

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O2

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
::clear(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
        *this)

{
  Container *pCVar1;
  int id;
  uint uVar2;
  ulong uVar3;
  
  if (this->capacity != 0) {
    pCVar1 = ((this->super_ObserverBase)._notifier)->container;
    uVar3 = (ulong)((long)(pCVar1->super_SmartDigraphBase)._arcs.
                          super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pCVar1->super_SmartDigraphBase)._arcs.
                         super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4;
    while( true ) {
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
      if (uVar2 == 0xffffffff) break;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&this->values[(int)uVar2].super__Vector_base<double,_std::allocator<double>_>);
    }
    operator_delete(this->values,(long)this->capacity * 0x18);
    this->capacity = 0;
  }
  return;
}

Assistant:

virtual void clear() {
    Notifier* nf = Parent::notifier();
    if (capacity != 0) {
      Item it;
      for (nf->first(it); it != INVALID; nf->next(it)) {
        int id = nf->id(it);
        AllocatorTraits::destroy(allocator, &(values[id]));
      }
      allocator.deallocate(values, capacity);
      capacity = 0;
    }
  }